

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_keyboard_test.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  bool bVar2;
  allocator local_529;
  io_service _io;
  string local_518;
  virtual_keyboard_handler vkey;
  
  boost::asio::io_context::io_context(&_io);
  std::__cxx11::string::string((string *)&local_518,"ccel_vkey",&local_529);
  ccel::udev::virtual_keyboard_handler::virtual_keyboard_handler(&vkey,&_io,&local_518,0x801);
  std::__cxx11::string::~string((string *)&local_518);
  ccel::udev::virtual_keyboard_handler::set_click_time(&vkey,0xe9,0x14);
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    ccel::udev::virtual_keyboard_handler::click(&vkey,0xe9);
  }
  ccel::udev::virtual_keyboard_handler::~virtual_keyboard_handler(&vkey);
  boost::asio::execution_context::~execution_context(&_io.super_execution_context);
  return 0;
}

Assistant:

int main(){
  ccel::io_service _io;
  ccel::udev::virtual_keyboard_handler vkey(_io);
  vkey.set_click_time(233,20);
  for(auto i=0;i<100;i++){
  vkey.click(233);
  }
  return 0;

}